

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O2

int Abc_NtkMfsResub(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  int iVar1;
  abctime aVar2;
  Vec_Ptr_t *pVVar3;
  abctime aVar4;
  Aig_Man_t *pAVar5;
  Cnf_Dat_t *pCVar6;
  sat_solver *psVar7;
  
  p->nNodesTried = p->nNodesTried + 1;
  Mfs_ManClean(p);
  aVar2 = Abc_Clock();
  pVVar3 = Abc_MfsComputeRoots(pNode,p->pPars->nWinTfoLevs,p->pPars->nFanoutsMax);
  p->vRoots = pVVar3;
  pVVar3 = Abc_NtkNodeSupport(p->pNtk,(Abc_Obj_t **)pVVar3->pArray,pVVar3->nSize);
  p->vSupp = pVVar3;
  pVVar3 = Abc_NtkDfsNodes(p->pNtk,(Abc_Obj_t **)p->vRoots->pArray,p->vRoots->nSize);
  p->vNodes = pVVar3;
  aVar4 = Abc_Clock();
  p->timeWin = p->timeWin + (aVar4 - aVar2);
  iVar1 = p->pPars->nWinMax;
  if ((iVar1 == 0) || (p->vNodes->nSize <= iVar1)) {
    aVar2 = Abc_Clock();
    iVar1 = Abc_ObjRequiredLevel(pNode);
    pVVar3 = Abc_MfsComputeDivisors(p,pNode,iVar1 + -1);
    p->vDivs = pVVar3;
    p->nTotalDivs = p->nTotalDivs + (pVVar3->nSize - (pNode->vFanins).nSize);
    aVar4 = Abc_Clock();
    p->timeDiv = p->timeDiv + (aVar4 - aVar2);
    aVar2 = Abc_Clock();
    pAVar5 = Abc_NtkConstructAig(p,pNode);
    p->pAigWin = pAVar5;
    aVar4 = Abc_Clock();
    p->timeAig = p->timeAig + (aVar4 - aVar2);
    aVar2 = Abc_Clock();
    pCVar6 = Cnf_DeriveSimple(p->pAigWin,p->vDivs->nSize + 1);
    p->pCnf = pCVar6;
    aVar4 = Abc_Clock();
    p->timeCnf = p->timeCnf + (aVar4 - aVar2);
    aVar2 = Abc_Clock();
    psVar7 = Abc_MfsCreateSolverResub(p,(int *)0x0,0,0);
    p->pSat = psVar7;
    if (psVar7 == (sat_solver *)0x0) {
      p->nNodesBad = p->nNodesBad + 1;
    }
    else {
      if (p->pPars->fPower == 0) {
        if (p->pPars->fSwapEdge == 0) {
          Abc_NtkMfsResubNode(p,pNode);
          if (p->pPars->fMoreEffort != 0) {
            Abc_NtkMfsResubNode2(p,pNode);
          }
        }
        else {
          Abc_NtkMfsEdgeSwapEval(p,pNode);
        }
      }
      else {
        Abc_NtkMfsEdgePower(p,pNode);
      }
      aVar4 = Abc_Clock();
      p->timeSat = p->timeSat + (aVar4 - aVar2);
    }
  }
  else {
    p->nMaxDivs = p->nMaxDivs + 1;
  }
  return 1;
}

Assistant:

int Abc_NtkMfsResub( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    abctime clk;
    p->nNodesTried++;
    // prepare data structure for this node
    Mfs_ManClean( p );
    // compute window roots, window support, and window nodes
clk = Abc_Clock();
    p->vRoots = Abc_MfsComputeRoots( pNode, p->pPars->nWinTfoLevs, p->pPars->nFanoutsMax );
    p->vSupp  = Abc_NtkNodeSupport( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
    p->vNodes = Abc_NtkDfsNodes( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
p->timeWin += Abc_Clock() - clk;
    if ( p->pPars->nWinMax && Vec_PtrSize(p->vNodes) > p->pPars->nWinMax )
    {
        p->nMaxDivs++;
        return 1;
    }
    // compute the divisors of the window
clk = Abc_Clock();
    p->vDivs  = Abc_MfsComputeDivisors( p, pNode, Abc_ObjRequiredLevel(pNode) - 1 );
    p->nTotalDivs += Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode);
p->timeDiv += Abc_Clock() - clk;
    // construct AIG for the window
clk = Abc_Clock();
    p->pAigWin = Abc_NtkConstructAig( p, pNode );
p->timeAig += Abc_Clock() - clk;
    // translate it into CNF
clk = Abc_Clock();
    p->pCnf = Cnf_DeriveSimple( p->pAigWin, 1 + Vec_PtrSize(p->vDivs) );
p->timeCnf += Abc_Clock() - clk;
    // create the SAT problem
clk = Abc_Clock();
    p->pSat = Abc_MfsCreateSolverResub( p, NULL, 0, 0 );
    if ( p->pSat == NULL )
    {
        p->nNodesBad++;
        return 1;
    }
//clk = Abc_Clock();
//    if ( p->pPars->fGiaSat )
//        Abc_NtkMfsConstructGia( p );
//p->timeGia += Abc_Clock() - clk;
    // solve the SAT problem
    if ( p->pPars->fPower )
        Abc_NtkMfsEdgePower( p, pNode );
    else if ( p->pPars->fSwapEdge )
        Abc_NtkMfsEdgeSwapEval( p, pNode );
    else
    {
        Abc_NtkMfsResubNode( p, pNode );
        if ( p->pPars->fMoreEffort )
            Abc_NtkMfsResubNode2( p, pNode );
    }
p->timeSat += Abc_Clock() - clk;
//    if ( p->pPars->fGiaSat )
//        Abc_NtkMfsDeconstructGia( p );
    return 1;
}